

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<false>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  RTCIntersectFunctionN p_Var10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  vint4 bi;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  vint4 ai;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar26 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  int mask;
  NodeRef stack [244];
  ulong *local_8d8;
  int local_8cc;
  ulong local_8c8;
  RayQueryContext *local_8c0;
  Ray *local_8b8;
  long local_8b0;
  long local_8a8;
  RTCIntersectFunctionNArguments local_8a0;
  Geometry *local_870;
  undefined8 local_868;
  RTCIntersectArguments *local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_8d8 = local_7d8 + 1;
      aVar3 = (ray->dir).field_0;
      auVar16 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx((undefined1  [16])aVar3,auVar25);
      auVar30._8_4_ = 0x219392ef;
      auVar30._0_8_ = 0x219392ef219392ef;
      auVar30._12_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar25,auVar30,1);
      auVar25 = vblendvps_avx((undefined1  [16])aVar3,auVar30,auVar25);
      auVar30 = vrcpps_avx(auVar25);
      fVar24 = auVar30._0_4_;
      auVar20._0_4_ = fVar24 * auVar25._0_4_;
      fVar27 = auVar30._4_4_;
      auVar20._4_4_ = fVar27 * auVar25._4_4_;
      fVar28 = auVar30._8_4_;
      auVar20._8_4_ = fVar28 * auVar25._8_4_;
      fVar29 = auVar30._12_4_;
      auVar20._12_4_ = fVar29 * auVar25._12_4_;
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar25 = vsubps_avx(auVar31,auVar20);
      auVar21._0_4_ = fVar24 + fVar24 * auVar25._0_4_;
      auVar21._4_4_ = fVar27 + fVar27 * auVar25._4_4_;
      auVar21._8_4_ = fVar28 + fVar28 * auVar25._8_4_;
      auVar21._12_4_ = fVar29 + fVar29 * auVar25._12_4_;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_7e8._4_4_ = uVar2;
      local_7e8._0_4_ = uVar2;
      local_7e8._8_4_ = uVar2;
      local_7e8._12_4_ = uVar2;
      auVar33 = ZEXT1664(local_7e8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_7f8._4_4_ = uVar2;
      local_7f8._0_4_ = uVar2;
      local_7f8._8_4_ = uVar2;
      local_7f8._12_4_ = uVar2;
      auVar34 = ZEXT1664(local_7f8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_808._4_4_ = uVar2;
      local_808._0_4_ = uVar2;
      local_808._8_4_ = uVar2;
      local_808._12_4_ = uVar2;
      auVar35 = ZEXT1664(local_808);
      local_818 = vshufps_avx(auVar21,auVar21,0);
      auVar36 = ZEXT1664(local_818);
      auVar25 = vmovshdup_avx(auVar21);
      local_828 = vshufps_avx(auVar21,auVar21,0x55);
      auVar37 = ZEXT1664(local_828);
      auVar30 = vshufpd_avx(auVar21,auVar21,1);
      local_838 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar38 = ZEXT1664(local_838);
      uVar12 = (ulong)(auVar21._0_4_ < 0.0) << 4;
      uVar15 = (ulong)(auVar25._0_4_ < 0.0) << 4 | 0x20;
      uVar11 = (ulong)(auVar30._0_4_ < 0.0) << 4 | 0x40;
      uVar14 = uVar12 ^ 0x10;
      local_848 = vshufps_avx(auVar16,auVar16,0);
      auVar26 = ZEXT1664(local_848);
      local_858 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      auVar32 = ZEXT1664(local_858);
      local_8c8 = uVar12;
      local_8c0 = context;
      local_8b8 = ray;
LAB_00b837eb:
      if (local_8d8 != local_7d8) {
        uVar13 = local_8d8[-1];
        local_8d8 = local_8d8 + -1;
        while ((uVar13 & 8) == 0) {
          auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar13 + 0x20 + uVar12),auVar33._0_16_);
          auVar16._0_4_ = auVar36._0_4_ * auVar25._0_4_;
          auVar16._4_4_ = auVar36._4_4_ * auVar25._4_4_;
          auVar16._8_4_ = auVar36._8_4_ * auVar25._8_4_;
          auVar16._12_4_ = auVar36._12_4_ * auVar25._12_4_;
          auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar13 + 0x20 + uVar15),auVar34._0_16_);
          auVar17._0_4_ = auVar37._0_4_ * auVar25._0_4_;
          auVar17._4_4_ = auVar37._4_4_ * auVar25._4_4_;
          auVar17._8_4_ = auVar37._8_4_ * auVar25._8_4_;
          auVar17._12_4_ = auVar37._12_4_ * auVar25._12_4_;
          auVar25 = vpmaxsd_avx(auVar16,auVar17);
          auVar16 = vsubps_avx(*(undefined1 (*) [16])(uVar13 + 0x20 + uVar11),auVar35._0_16_);
          auVar18._0_4_ = auVar38._0_4_ * auVar16._0_4_;
          auVar18._4_4_ = auVar38._4_4_ * auVar16._4_4_;
          auVar18._8_4_ = auVar38._8_4_ * auVar16._8_4_;
          auVar18._12_4_ = auVar38._12_4_ * auVar16._12_4_;
          auVar16 = vpmaxsd_avx(auVar18,auVar26._0_16_);
          auVar25 = vpmaxsd_avx(auVar25,auVar16);
          auVar16 = vsubps_avx(*(undefined1 (*) [16])(uVar13 + 0x20 + uVar14),auVar33._0_16_);
          auVar19._0_4_ = auVar36._0_4_ * auVar16._0_4_;
          auVar19._4_4_ = auVar36._4_4_ * auVar16._4_4_;
          auVar19._8_4_ = auVar36._8_4_ * auVar16._8_4_;
          auVar19._12_4_ = auVar36._12_4_ * auVar16._12_4_;
          auVar16 = vsubps_avx(*(undefined1 (*) [16])(uVar13 + 0x20 + (uVar15 ^ 0x10)),
                               auVar34._0_16_);
          auVar22._0_4_ = auVar37._0_4_ * auVar16._0_4_;
          auVar22._4_4_ = auVar37._4_4_ * auVar16._4_4_;
          auVar22._8_4_ = auVar37._8_4_ * auVar16._8_4_;
          auVar22._12_4_ = auVar37._12_4_ * auVar16._12_4_;
          auVar16 = vpminsd_avx(auVar19,auVar22);
          auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar13 + 0x20 + (uVar11 ^ 0x10)),
                               auVar35._0_16_);
          auVar23._0_4_ = auVar38._0_4_ * auVar30._0_4_;
          auVar23._4_4_ = auVar38._4_4_ * auVar30._4_4_;
          auVar23._8_4_ = auVar38._8_4_ * auVar30._8_4_;
          auVar23._12_4_ = auVar38._12_4_ * auVar30._12_4_;
          auVar30 = vpminsd_avx(auVar23,auVar32._0_16_);
          auVar16 = vpminsd_avx(auVar16,auVar30);
          auVar25 = vpcmpgtd_avx(auVar25,auVar16);
          iVar6 = vmovmskps_avx(auVar25);
          if (iVar6 == 0xf) goto LAB_00b837eb;
          bVar5 = (byte)iVar6 ^ 0xf;
          uVar7 = uVar13 & 0xfffffffffffffff0;
          lVar4 = 0;
          if (bVar5 != 0) {
            for (; (bVar5 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar13 = *(ulong *)(uVar7 + lVar4 * 8);
          uVar8 = bVar5 - 1 & (uint)bVar5;
          uVar9 = (ulong)uVar8;
          if (uVar8 != 0) {
            do {
              *local_8d8 = uVar13;
              local_8d8 = local_8d8 + 1;
              lVar4 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              uVar13 = *(ulong *)(uVar7 + lVar4 * 8);
              uVar9 = uVar9 - 1 & uVar9;
            } while (uVar9 != 0);
          }
        }
        local_8b0 = (ulong)((uint)uVar13 & 0xf) - 8;
        for (local_8a8 = 0; local_8b0 != local_8a8; local_8a8 = local_8a8 + 1) {
          local_8a0.geomID = *(uint *)((uVar13 & 0xfffffffffffffff0) + local_8a8 * 8);
          local_870 = (context->scene->geometries).items[local_8a0.geomID].ptr;
          if ((ray->mask & local_870->mask) != 0) {
            local_8a0.primID = *(uint *)((uVar13 & 0xfffffffffffffff0) + 4 + local_8a8 * 8);
            local_8cc = -1;
            local_8a0.valid = &local_8cc;
            local_8a0.geometryUserPtr = local_870->userPtr;
            local_8a0.context = context->user;
            local_8a0.N = 1;
            local_868 = 0;
            local_860 = context->args;
            p_Var10 = local_860->intersect;
            if (p_Var10 == (RTCIntersectFunctionN)0x0) {
              p_Var10 = (RTCIntersectFunctionN)
                        local_870[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                        _M_i;
            }
            local_8a0.rayhit = (RTCRayHitN *)ray;
            (*p_Var10)(&local_8a0);
            auVar33 = ZEXT1664(local_7e8);
            auVar34 = ZEXT1664(local_7f8);
            auVar35 = ZEXT1664(local_808);
            auVar36 = ZEXT1664(local_818);
            auVar37 = ZEXT1664(local_828);
            auVar38 = ZEXT1664(local_838);
            auVar26 = ZEXT1664(local_848);
            auVar32 = ZEXT1664(local_858);
            context = local_8c0;
            ray = local_8b8;
            uVar12 = local_8c8;
            if (local_8b8->tfar < 0.0) {
              local_8b8->tfar = -INFINITY;
              return;
            }
          }
        }
        goto LAB_00b837eb;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }